

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O1

void __thiscall CaDiCaL::Internal::mark_satisfied_clauses_as_garbage(Internal *this)

{
  long lVar1;
  pointer ppCVar2;
  Clause *c_00;
  int iVar3;
  Clause **c;
  pointer ppCVar4;
  
  lVar1 = (this->stats).all.fixed;
  if ((this->last).collect.fixed < lVar1) {
    (this->last).collect.fixed = lVar1;
    ppCVar2 = (this->clauses).
              super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar4 = (this->clauses).
                   super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppCVar4 != ppCVar2; ppCVar4 = ppCVar4 + 1) {
      c_00 = *ppCVar4;
      if ((c_00->field_0x8 & 0x10) == 0) {
        iVar3 = clause_contains_fixed_literal(this,c_00);
        if (iVar3 < 1) {
          if (iVar3 < 0) {
            remove_falsified_literals(this,c_00);
          }
        }
        else {
          mark_garbage(this,c_00);
        }
      }
    }
  }
  return;
}

Assistant:

void Internal::mark_satisfied_clauses_as_garbage () {

  if (last.collect.fixed >= stats.all.fixed)
    return;
  last.collect.fixed = stats.all.fixed;

  LOG ("marking satisfied clauses and removing falsified literals");

  for (const auto &c : clauses) {
    if (c->garbage)
      continue;
    const int tmp = clause_contains_fixed_literal (c);
    if (tmp > 0)
      mark_garbage (c);
    else if (tmp < 0)
      remove_falsified_literals (c);
  }
}